

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O0

bool __thiscall
glcts::ViewportArray::DepthRangeDepthTest::checkResults
          (DepthRangeDepthTest *this,texture *texture_0,texture *param_2,GLuint draw_call_index)

{
  byte bVar1;
  texture *this_00;
  reference pvVar2;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *pMVar3;
  MessageBuilder local_1e0;
  float local_60;
  float local_5c;
  GLfloat far;
  GLfloat near;
  GLuint i;
  undefined1 local_48 [8];
  vector<float,_std::allocator<float>_> texture_data;
  float local_28;
  GLuint GStack_24;
  bool check_result;
  GLfloat depth_value;
  GLuint draw_call_index_local;
  texture *param_3_local;
  texture *texture_0_local;
  DepthRangeDepthTest *this_local;
  
  local_28 = (float)draw_call_index * 0.0625;
  texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 1;
  GStack_24 = draw_call_index;
  _depth_value = param_2;
  param_3_local = texture_0;
  texture_0_local = (texture *)this;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_48);
  std::vector<float,_std::allocator<float>_>::resize
            ((vector<float,_std::allocator<float>_> *)local_48,0x20);
  this_00 = param_3_local;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_48,0);
  Utils::texture::get(this_00,0x1903,0x1406,pvVar2);
  far = 0.0;
  do {
    if (0xf < (uint)far) {
LAB_01710ff7:
      bVar1 = texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_48);
      return (bool)(bVar1 & 1);
    }
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,(ulong)(uint)far);
    local_5c = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)local_48,(ulong)((int)far + 0x10));
    local_60 = *pvVar2;
    if ((local_28 <= local_5c) || (local_28 <= local_60)) {
      this_01 = deqp::Context::getTestContext
                          ((this->super_DrawTestBase).super_TestCaseBase.m_context);
      this_02 = tcu::TestContext::getLog(this_01);
      tcu::TestLog::operator<<(&local_1e0,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<(&local_1e0,(char (*) [19])"Invalid values at ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(uint *)&far);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [14])" depth value ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_28);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])0x2b89e12);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_5c);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a4b1eb);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_60);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x29ea7ce);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1e0);
      texture_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._7_1_ = 0;
      goto LAB_01710ff7;
    }
    far = (GLfloat)((int)far + 1);
  } while( true );
}

Assistant:

bool DepthRangeDepthTest::checkResults(Utils::texture& texture_0, Utils::texture& /* texture_1 */,
									   GLuint		   draw_call_index)
{
	static const GLfloat step = 1.0f / 16.0f;

	const GLfloat depth_value = step * (GLfloat)draw_call_index;

	bool check_result = true;

	std::vector<GLfloat> texture_data;
	texture_data.resize(m_r32f_width * m_r32f_height);
	texture_0.get(GL_RED, GL_FLOAT, &texture_data[0]);

	for (GLuint i = 0; i < 16; ++i)
	{
		/* Bottom row should contain near values, top one should contain far values */
		const GLfloat near = texture_data[i];
		const GLfloat far  = texture_data[i + 16];

		if ((depth_value <= near) || (depth_value <= far))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Invalid values at " << i << " depth value "
												<< depth_value << " got [" << near << ", " << far << "]"
												<< tcu::TestLog::EndMessage;

			check_result = false;
			break;
		}
	}

	return check_result;
}